

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

string * __thiscall duckdb::Vector::ToString_abi_cxx11_(string *__return_storage_ptr__,Vector *this)

{
  VectorType VVar1;
  VectorType in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  Value local_98;
  string local_58;
  string local_38;
  
  VectorTypeToString_abi_cxx11_(&local_38,(duckdb *)(ulong)this->vector_type,in_DL);
  ::std::operator+(&bStack_b8,&local_38," ");
  LogicalType::ToString_abi_cxx11_(&local_58,&this->type);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                   &bStack_b8,&local_58);
  ::std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                   ": (UNKNOWN COUNT) [ ");
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&bStack_b8);
  ::std::__cxx11::string::~string((string *)&local_38);
  VVar1 = this->vector_type;
  if ((1 < VVar1 - 3) && (VVar1 != FLAT_VECTOR)) {
    if (VVar1 == CONSTANT_VECTOR) {
      GetValue(&local_98,this,0);
      Value::ToString_abi_cxx11_(&bStack_b8,&local_98);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&bStack_b8);
      Value::~Value(&local_98);
    }
    else {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string Vector::ToString() const {
	string retval = VectorTypeToString(GetVectorType()) + " " + GetType().ToString() + ": (UNKNOWN COUNT) [ ";
	switch (GetVectorType()) {
	case VectorType::FLAT_VECTOR:
	case VectorType::DICTIONARY_VECTOR:
		break;
	case VectorType::CONSTANT_VECTOR:
		retval += GetValue(0).ToString();
		break;
	case VectorType::SEQUENCE_VECTOR: {
		break;
	}
	default:
		retval += "UNKNOWN VECTOR TYPE";
		break;
	}
	retval += "]";
	return retval;
}